

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qzip.cpp
# Opt level: O0

void __thiscall QZipWriter::addDirectory(QZipWriter *this,QString *dirName)

{
  bool bVar1;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_00000028;
  QString *in_stack_00000030;
  EntryType in_stack_0000003c;
  QString name;
  QString *in_stack_ffffffffffffff68;
  CaseSensitivity in_stack_ffffffffffffff74;
  QString *in_stack_ffffffffffffff78;
  QString *in_stack_ffffffffffffff80;
  QChar c;
  QChar local_2c;
  QChar local_2a;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  c.ucs = (char16_t)((ulong)in_RDI >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QDir::fromNativeSeparators(in_stack_ffffffffffffff68);
  QChar::QChar<char16_t,_true>(&local_2a,L'/');
  bVar1 = QString::endsWith(in_stack_ffffffffffffff78,c,in_stack_ffffffffffffff74);
  if (!bVar1) {
    QChar::QChar<char16_t,_true>(&local_2c,L'/');
    QString::append(in_stack_ffffffffffffff80,c);
  }
  QByteArray::QByteArray((QByteArray *)0x32212a);
  QZipWriterPrivate::addEntry
            ((QZipWriterPrivate *)dirName,in_stack_0000003c,in_stack_00000030,in_stack_00000028);
  QByteArray::~QByteArray((QByteArray *)0x32214c);
  QString::~QString((QString *)0x322156);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QZipWriter::addDirectory(const QString &dirName)
{
    QString name(QDir::fromNativeSeparators(dirName));
    // separator is mandatory
    if (!name.endsWith(u'/'))
        name.append(u'/');
    d->addEntry(QZipWriterPrivate::Directory, name, QByteArray());
}